

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

ResolvedTrace * __thiscall
backward::TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol>::resolve
          (ResolvedTrace *__return_storage_ptr__,
          TraceResolverLinuxImpl<backward::trace_resolver_tag::backtrace_symbol> *this,
          ResolvedTrace *trace)

{
  char *__first;
  byte *pbVar1;
  char *__last;
  string sStack_48;
  
  __first = (this->_symbols)._val[(trace->super_Trace).idx];
  for (__last = __first; (*__last != '\0' && (*__last != '(')); __last = __last + 1) {
  }
  std::__cxx11::string::assign<char*,void>((string *)&trace->object_filename,__first,__last);
  if (*__last != '\0') {
    pbVar1 = (byte *)(__last + 1);
    while ((0x2b < (ulong)*pbVar1 || ((0xa0000000001U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0))) {
      pbVar1 = pbVar1 + 1;
    }
    *pbVar1 = 0;
    details::demangler_impl<backward::system_tag::linux_tag>::demangle_abi_cxx11_
              (&sStack_48,
               &(this->super_TraceResolverLinuxBase).super_TraceResolverImplBase._demangler.
                super_demangler_impl<backward::system_tag::linux_tag>,__last + 1);
    std::__cxx11::string::operator=((string *)&trace->object_function,(string *)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    std::__cxx11::string::_M_assign((string *)&trace->source);
  }
  ResolvedTrace::ResolvedTrace(__return_storage_ptr__,trace);
  return __return_storage_ptr__;
}

Assistant:

ResolvedTrace resolve(ResolvedTrace trace) override {
    char *filename = _symbols[trace.idx];
    char *funcname = filename;
    while (*funcname && *funcname != '(') {
      funcname += 1;
    }
    trace.object_filename.assign(filename,
                                 funcname); // ok even if funcname is the ending
                                            // \0 (then we assign entire string)

    if (*funcname) { // if it's not end of string (e.g. from last frame ip==0)
      funcname += 1;
      char *funcname_end = funcname;
      while (*funcname_end && *funcname_end != ')' && *funcname_end != '+') {
        funcname_end += 1;
      }
      *funcname_end = '\0';
      trace.object_function = this->demangle(funcname);
      trace.source.function = trace.object_function; // we cannot do better.
    }
    return trace;
  }